

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void rgb_rgb565_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                       JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  JSAMPROW pJVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint b_1;
  uint g_1;
  uint r_1;
  JLONG rgb_1;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW inptr2_1;
  JSAMPROW inptr1_1;
  JSAMPROW inptr0_1;
  JSAMPROW outptr_1;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  int test_value;
  JDIMENSION local_50;
  uint b;
  uint g;
  uint r;
  JLONG rgb;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  
  local_50 = cinfo->output_width;
  inptr1._4_4_ = num_rows;
  inptr0 = (JSAMPROW)output_buf;
  outptr._4_4_ = input_row;
  while (inptr1._4_4_ = inptr1._4_4_ + -1, -1 < inptr1._4_4_) {
    pbVar5 = (*input_buf)[outptr._4_4_];
    pbVar6 = input_buf[1][outptr._4_4_];
    pbVar7 = input_buf[2][outptr._4_4_];
    outptr._4_4_ = outptr._4_4_ + 1;
    pJVar4 = inptr0 + 8;
    inptr2 = *(JSAMPROW *)inptr0;
    _g = pbVar7;
    rgb = (JLONG)pbVar6;
    _num_cols = pbVar5;
    if (((ulong)inptr2 & 3) != 0) {
      _num_cols = pbVar5 + 1;
      rgb = (JLONG)(pbVar6 + 1);
      _g = pbVar7 + 1;
      *(ushort *)inptr2 = (*pbVar5 & 0xf8) << 8 | (*pbVar6 & 0xfc) << 3 | (ushort)(*pbVar7 >> 3);
      inptr2 = (JSAMPROW)((long)inptr2 + 2);
      local_50 = local_50 - 1;
    }
    for (b = 0; b < local_50 >> 1; b = b + 1) {
      pbVar5 = _num_cols + 1;
      bVar1 = *_num_cols;
      pbVar6 = (byte *)(rgb + 1);
      bVar2 = *(byte *)rgb;
      pbVar7 = _g + 1;
      bVar3 = *_g;
      _num_cols = _num_cols + 2;
      rgb = rgb + 2;
      _g = _g + 2;
      *(uint *)inptr2 =
           ((*pbVar5 & 0xf8) << 8 | (*pbVar6 & 0xfc) << 3 | (uint)(*pbVar7 >> 3)) << 0x10 |
           (bVar1 & 0xf8) << 8 | (bVar2 & 0xfc) << 3 | (uint)(bVar3 >> 3);
      inptr2 = inptr2 + 4;
    }
    inptr0 = pJVar4;
    if ((local_50 & 1) != 0) {
      *(ushort *)inptr2 = (*_num_cols & 0xf8) << 8 | (*(byte *)rgb & 0xfc) << 3 | (ushort)(*_g >> 3)
      ;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb565_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    rgb_rgb565_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    rgb_rgb565_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}